

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_dupset(Curl_easy *dst,Curl_easy *src)

{
  char **__s;
  CURLcode CVar1;
  size_t length;
  char *pcVar2;
  long lVar3;
  
  memcpy(&dst->set,&src->set,0x6b8);
  __s = (dst->set).str;
  lVar3 = 0;
  memset(__s,0,0x1c0);
  while (lVar3 != 0x1b0) {
    CVar1 = setstropt((char **)((long)__s + lVar3),*(char **)((long)(src->set).str + lVar3));
    lVar3 = lVar3 + 8;
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  lVar3 = (src->set).postfieldsize;
  if (lVar3 == 0) {
    return CURLE_OK;
  }
  pcVar2 = (src->set).str[0x37];
  if (pcVar2 == (char *)0x0) {
    return CURLE_OK;
  }
  length = curlx_sotouz(lVar3);
  pcVar2 = (char *)Curl_memdup(pcVar2,length);
  (dst->set).str[0x37] = pcVar2;
  if (pcVar2 != (char *)0x0) {
    (dst->set).postfields = pcVar2;
    return CURLE_OK;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_dupset(struct Curl_easy *dst, struct Curl_easy *src)
{
  CURLcode result = CURLE_OK;
  enum dupstring i;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;

  /* clear all string pointers first */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));

  /* duplicate all strings */
  for(i=(enum dupstring)0; i< STRING_LASTZEROTERMINATED; i++) {
    result = setstropt(&dst->set.str[i], src->set.str[i]);
    if(result)
      return result;
  }

  /* duplicate memory areas pointed to */
  i = STRING_COPYPOSTFIELDS;
  if(src->set.postfieldsize && src->set.str[i]) {
    /* postfieldsize is curl_off_t, Curl_memdup() takes a size_t ... */
    dst->set.str[i] = Curl_memdup(src->set.str[i],
                                  curlx_sotouz(src->set.postfieldsize));
    if(!dst->set.str[i])
      return CURLE_OUT_OF_MEMORY;
    /* point to the new copy */
    dst->set.postfields = dst->set.str[i];
  }

  return CURLE_OK;
}